

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifUtil.c
# Opt level: O0

void If_ManResetOriginalRefs(If_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  If_Obj_t *pObj_00;
  int local_1c;
  int i;
  If_Obj_t *pObj;
  If_Man_t *p_local;
  
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
    pvVar2 = Vec_PtrEntry(p->vObjs,local_1c);
    *(undefined4 *)((long)pvVar2 + 0xc) = 0;
  }
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
    pObj_00 = (If_Obj_t *)Vec_PtrEntry(p->vObjs,local_1c);
    iVar1 = If_ObjIsAnd(pObj_00);
    if (iVar1 == 0) {
      iVar1 = If_ObjIsCo(pObj_00);
      if (iVar1 != 0) {
        pObj_00->pFanin0->nRefs = pObj_00->pFanin0->nRefs + 1;
      }
    }
    else {
      pObj_00->pFanin0->nRefs = pObj_00->pFanin0->nRefs + 1;
      pObj_00->pFanin1->nRefs = pObj_00->pFanin1->nRefs + 1;
    }
  }
  return;
}

Assistant:

void If_ManResetOriginalRefs( If_Man_t * p )
{
    If_Obj_t * pObj;
    int i;
    If_ManForEachObj( p, pObj, i )
        pObj->nRefs = 0;
    If_ManForEachObj( p, pObj, i )
    {
        if ( If_ObjIsAnd(pObj) )
        {
            pObj->pFanin0->nRefs++;
            pObj->pFanin1->nRefs++;
        }
        else if ( If_ObjIsCo(pObj) )
            pObj->pFanin0->nRefs++;
    }
}